

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

Promise<void> __thiscall
kj::anon_unknown_0::TestWebSocketService::request
          (TestWebSocketService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  uint uVar1;
  _func_int *p_Var2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  Disposer *node;
  long *plVar6;
  bool bVar7;
  int iVar8;
  undefined4 in_register_00000034;
  long lVar9;
  HttpHeaderId id;
  StringPtr message;
  DebugExpression<bool> _kjCondition;
  HttpHeaders responseHeaders;
  String local_e8;
  Own<kj::WebSocket,_std::nullptr_t> local_d0;
  StringPtr local_c0;
  undefined8 *local_b0;
  long *local_a8;
  HttpHeaders local_a0;
  undefined1 local_40 [8];
  undefined8 local_38;
  ArrayPtr<const_char> local_30;
  
  lVar9 = CONCAT44(in_register_00000034,method);
  local_c0.content.ptr = (char *)url.content.size_;
  local_c0.content.size_ = (size_t)headers;
  bVar7 = HttpHeaders::isWebSocket((HttpHeaders *)requestBody);
  local_e8.content.ptr = (char *)CONCAT71(local_e8.content.ptr._1_7_,bVar7);
  if (!bVar7) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x9ec,FAILED,"headers.isWebSocket()","_kjCondition,",
               (DebugExpression<bool> *)&local_e8);
    kj::_::Debug::Fault::fatal((Fault *)&local_a0);
  }
  HttpHeaders::HttpHeaders(&local_a0,*(HttpHeaderTable **)(lVar9 + 0x10));
  uVar1 = *(uint *)(lVar9 + 0x20);
  p_Var2 = requestBody[1]._vptr_AsyncInputStream[(ulong)uVar1 * 2 + 1];
  if ((_func_int *)0x1 < p_Var2) {
    local_30.ptr = (char *)requestBody[1]._vptr_AsyncInputStream[(ulong)uVar1 * 2];
    uVar3 = *(undefined8 *)(lVar9 + 0x18);
    local_d0.disposer = (Disposer *)0x4f703f;
    local_d0.ptr = (WebSocket *)&DAT_00000008;
    local_30.size_ = (size_t)(p_Var2 + -1);
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_e8,(_ *)&local_d0,&local_30,(ArrayPtr<const_char> *)local_30.ptr);
    id.id = uVar1;
    id.table = (HttpHeaderTable *)uVar3;
    id._12_4_ = 0;
    HttpHeaders::set(&local_a0,id,&local_e8);
    sVar5 = local_e8.content.size_;
    pcVar4 = local_e8.content.ptr;
    if ((_func_int **)local_e8.content.ptr != (_func_int **)0x0) {
      local_e8.content.ptr = (char *)0x0;
      local_e8.content.size_ = 0;
      (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
                (local_e8.content.disposer,pcVar4,1,sVar5,sVar5,0);
    }
  }
  if ((HttpHeaders *)local_c0.content.size_ == (HttpHeaders *)0xb) {
    iVar8 = bcmp(local_c0.content.ptr,"/websocket",0xb);
    if (iVar8 == 0) {
      (**(code **)(*__kjCondition + 8))(&local_e8,__kjCondition,&local_a0);
      message.content.size_ = (size_t)"start-inline";
      message.content.ptr = (char *)local_e8.content.size_;
      doWebSocket((WebSocket *)&local_d0,message);
      Promise<void>::attach<kj::Own<kj::WebSocket,decltype(nullptr)>>
                ((Promise<void> *)this,&local_d0);
      node = local_d0.disposer;
      if ((PromiseArenaMember *)local_d0.disposer != (PromiseArenaMember *)0x0) {
        local_d0.disposer = (Disposer *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
      }
      sVar5 = local_e8.content.size_;
      if ((long *)local_e8.content.size_ != (long *)0x0) {
        local_e8.content.size_ = 0;
        (**(code **)*(_func_int **)local_e8.content.ptr)
                  (local_e8.content.ptr,sVar5 + *(long *)(*(long *)sVar5 + -0x10));
      }
LAB_003211a4:
      HttpHeaders::~HttpHeaders(&local_a0);
      return (PromiseBase)(PromiseBase)this;
    }
  }
  else if (((HttpHeaders *)local_c0.content.size_ == (HttpHeaders *)&DAT_0000000e) &&
          (iVar8 = bcmp(local_c0.content.ptr,"/return-error",0xe), iVar8 == 0)) {
    local_40[0] = 1;
    local_38 = 0;
    (**(code **)*__kjCondition)(&local_b0,__kjCondition,0x194,"Not Found",10,&local_a0,local_40);
    plVar6 = local_a8;
    if (local_a8 != (long *)0x0) {
      local_a8 = (long *)0x0;
      (**(code **)*local_b0)(local_b0,(long)plVar6 + *(long *)(*plVar6 + -0x10));
    }
    kj::_::readyNow();
    (this->super_HttpService)._vptr_HttpService = (_func_int **)local_e8.content.ptr;
    goto LAB_003211a4;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16],kj::StringPtr&>
            ((Fault *)&local_e8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
             ,0x9fa,FAILED,(char *)0x0,"\"unexpected path\", url",(char (*) [16])"unexpected path",
             &local_c0);
  kj::_::Debug::Fault::fatal((Fault *)&local_e8);
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    KJ_ASSERT(headers.isWebSocket());

    HttpHeaders responseHeaders(headerTable);
    KJ_IF_SOME(h, headers.get(hMyHeader)) {
      responseHeaders.set(hMyHeader, kj::str("respond-", h));
    }

    if (url == "/return-error") {
      response.send(404, "Not Found", responseHeaders, uint64_t(0));
      return kj::READY_NOW;
    } else if (url == "/websocket") {
      auto ws = response.acceptWebSocket(responseHeaders);
      return doWebSocket(*ws, "start-inline").attach(kj::mv(ws));
    } else {
      KJ_FAIL_ASSERT("unexpected path", url);
    }
  }